

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_writer.cpp
# Opt level: O3

unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true> __thiscall
duckdb::ColumnWriter::CreateWriterRecursive
          (ColumnWriter *this,ClientContext *context,ParquetWriter *writer,
          vector<duckdb_parquet::SchemaElement,_true> *parquet_schemas,ParquetColumnSchema *schema,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *path_in_schema)

{
  LogicalType *this_00;
  LogicalTypeId LVar1;
  PhysicalType PVar2;
  ParquetColumnSchema *pPVar3;
  pointer pbVar4;
  pointer pbVar5;
  pointer pbVar6;
  _Head_base<0UL,_duckdb::ColumnWriter_*,_false> _Var7;
  pointer puVar8;
  _func_int *p_Var9;
  _func_int *p_Var10;
  int iVar11;
  const_reference pvVar12;
  undefined8 *puVar13;
  const_reference pvVar14;
  ArrayColumnWriter *this_01;
  _func_int *p_Var15;
  _func_int **pp_Var16;
  InternalException *this_02;
  ParquetColumnSchema *pPVar17;
  char *pcVar18;
  size_type __n;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_03;
  bool bVar19;
  bool bVar20;
  bool can_have_nulls;
  undefined1 local_159;
  ParquetWriter *local_158;
  _Head_base<0UL,_duckdb::ColumnWriter_*,_false> local_150;
  pointer local_148;
  pointer pbStack_140;
  ParquetColumnSchema *local_130;
  undefined1 local_128 [32];
  vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
  local_108;
  ClientContext *local_e8;
  pointer pbStack_e0;
  _Head_base<0UL,_duckdb::ColumnWriter_*,_false> local_d8;
  _func_int *p_Stack_d0;
  _func_int *local_c8;
  undefined1 local_b8 [56];
  string local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48 [24];
  
  local_158 = writer;
  local_150._M_head_impl = this;
  local_e8 = context;
  pvVar12 = vector<duckdb_parquet::SchemaElement,_true>::operator[]
                      (parquet_schemas,schema->schema_index);
  local_159 = (code)(pvVar12->repetition_type == OPTIONAL);
  local_148 = (pointer)path_in_schema;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)path_in_schema,&schema->name);
  LVar1 = (schema->type).id_;
  local_130 = schema;
  if ((LVar1 == UNION) || (LVar1 == STRUCT)) {
    local_108.
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ::reserve(&local_108,
              ((long)(schema->children).
                     super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                     .
                     super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(schema->children).
                     super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                     .
                     super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x71c71c71c71c71c7);
    pPVar17 = (schema->children).
              super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
              .
              super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pPVar3 = (schema->children).
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pPVar17 != pPVar3) {
      do {
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(local_48,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_148);
        CreateWriterRecursive
                  ((ColumnWriter *)local_128,local_e8,local_158,parquet_schemas,pPVar17,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)local_48);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>>>
                    *)&local_108,
                   (unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>
                    *)local_128);
        if ((_func_int **)local_128._0_8_ != (_func_int **)0x0) {
          (**(code **)(*(_func_int **)local_128._0_8_ + 8))();
        }
        local_128._0_8_ = (_func_int **)0x0;
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_48);
        pPVar17 = pPVar17 + 1;
      } while (pPVar17 != pPVar3);
    }
    puVar13 = (undefined8 *)operator_new(0x50);
    puVar8 = local_108.
             super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pbVar4 = (pointer)(local_148->field_2)._M_allocated_capacity;
    pbVar5 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_148->_M_dataplus)->_M_impl)->_M_impl).super__Vector_impl_data._M_start
    ;
    pbVar6 = (pointer)local_148->_M_string_length;
    (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)&((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_148->_M_dataplus)->_M_impl)->_M_impl).super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_148->_M_string_length = 0;
    (local_148->field_2)._M_allocated_capacity = 0;
    local_148 = (pointer)local_108.
                         super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
    pbStack_140 = (pointer)local_108.
                           super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
    local_108.
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8._M_head_impl = (ColumnWriter *)0x0;
    p_Stack_d0 = (_func_int *)0x0;
    local_c8 = (_func_int *)0x0;
    puVar13[1] = local_158;
    puVar13[2] = local_130;
    puVar13[3] = pbVar5;
    puVar13[4] = pbVar6;
    puVar13[5] = pbVar4;
    local_128._16_8_ = (ParquetColumnSchema *)0x0;
    local_128._0_8_ = (_func_int **)0x0;
    local_128._8_8_ = (ParquetWriter *)0x0;
    *(code *)(puVar13 + 6) = local_159;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_128);
    *puVar13 = &PTR__StructColumnWriter_0247eeb0;
    puVar13[7] = local_148;
    puVar13[8] = pbStack_140;
    puVar13[9] = puVar8;
    local_b8._16_8_ = (ParquetColumnSchema *)0x0;
    local_b8._0_8_ = (pointer)0x0;
    local_b8._8_8_ = (ParquetWriter *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
               *)local_b8);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_d8);
    (local_150._M_head_impl)->_vptr_ColumnWriter = puVar13;
LAB_01ba45a3:
    _Var7._M_head_impl = local_150._M_head_impl;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ::~vector(&local_108);
    return (unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>)
           _Var7._M_head_impl;
  }
  this_00 = &schema->type;
  if (LVar1 < MAP) {
    if (LVar1 != BLOB) {
      bVar20 = LVar1 == LIST;
      goto LAB_01ba45ea;
    }
    LogicalType::GetAlias_abi_cxx11_((string *)local_128,this_00);
    iVar11 = ::std::__cxx11::string::compare((char *)local_128);
    if (iVar11 == 0) {
      bVar20 = GeoParquetFileMetadata::IsGeoParquetConversionEnabled(local_e8);
    }
    else {
      bVar20 = false;
    }
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_);
    }
    if (bVar20 != false) {
      make_uniq<duckdb::WKBColumnWriter,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&,std::__cxx11::string_const&>
                ((duckdb *)local_128,local_158,local_130,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)local_148,(bool *)&local_159,&schema->name);
      goto LAB_01ba4e01;
    }
    LVar1 = this_00->id_;
  }
  else {
    if (LVar1 == MAP) {
      local_128._0_8_ = local_128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"key_value","");
      pPVar17 = local_130;
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
      if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
        operator_delete((void *)local_128._0_8_);
      }
      local_108.
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
      ::reserve(&local_108,2);
      __n = 0;
      bVar20 = true;
      do {
        bVar19 = bVar20;
        pvVar14 = vector<duckdb::ParquetColumnSchema,_true>::operator[](&pPVar17->children,__n);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(local_60,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_148);
        CreateWriterRecursive
                  ((ColumnWriter *)local_128,local_e8,local_158,parquet_schemas,pvVar14,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)local_60);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_60);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>>>
                    *)&local_108,
                   (unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>
                    *)local_128);
        if ((_func_int **)local_128._0_8_ != (_func_int **)0x0) {
          (**(code **)(*(_func_int **)local_128._0_8_ + 8))();
        }
        __n = 1;
        bVar20 = false;
      } while (bVar19);
      p_Var15 = (_func_int *)operator_new(0x50);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_d8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_148);
      p_Var10 = local_c8;
      p_Var9 = p_Stack_d0;
      _Var7._M_head_impl = local_d8._M_head_impl;
      puVar8 = local_108.
               super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_e8 = (ClientContext *)
                 local_108.
                 super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pbStack_e0 = (pointer)local_108.
                            super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
      local_108.
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d8._M_head_impl = (ColumnWriter *)0x0;
      p_Stack_d0 = (_func_int *)0x0;
      local_c8 = (_func_int *)0x0;
      *(undefined ***)p_Var15 = &PTR__ColumnWriter_0247b9a8;
      *(ParquetWriter **)(p_Var15 + 8) = local_158;
      *(ParquetColumnSchema **)(p_Var15 + 0x10) = local_130;
      *(ColumnWriter **)(p_Var15 + 0x18) = _Var7._M_head_impl;
      *(_func_int **)(p_Var15 + 0x20) = p_Var9;
      *(_func_int **)(p_Var15 + 0x28) = p_Var10;
      local_128._16_8_ = (ParquetColumnSchema *)0x0;
      local_128._0_8_ = (_func_int **)0x0;
      local_128._8_8_ = (ParquetWriter *)0x0;
      p_Var15[0x30] = local_159;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_128);
      *(undefined ***)p_Var15 = &PTR__StructColumnWriter_0247eeb0;
      *(ClientContext **)(p_Var15 + 0x38) = local_e8;
      *(pointer *)(p_Var15 + 0x40) = pbStack_e0;
      *(pointer *)(p_Var15 + 0x48) = puVar8;
      local_b8._16_8_ = (ParquetColumnSchema *)0x0;
      local_b8._0_8_ = (pointer)0x0;
      local_b8._8_8_ = (ParquetWriter *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
                 *)local_b8);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_d8);
      pp_Var16 = (_func_int **)operator_new(0x40);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_d8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_148);
      p_Var10 = local_c8;
      p_Var9 = p_Stack_d0;
      _Var7._M_head_impl = local_d8._M_head_impl;
      local_d8._M_head_impl = (ColumnWriter *)0x0;
      p_Stack_d0 = (_func_int *)0x0;
      local_c8 = (_func_int *)0x0;
      *pp_Var16 = (_func_int *)&PTR__ColumnWriter_0247b9a8;
      pp_Var16[1] = (_func_int *)local_158;
      pp_Var16[2] = (_func_int *)local_130;
      pp_Var16[3] = (_func_int *)_Var7._M_head_impl;
      pp_Var16[4] = p_Var9;
      pp_Var16[5] = p_Var10;
      local_128._16_8_ = (ParquetColumnSchema *)0x0;
      local_128._0_8_ = (_func_int **)0x0;
      local_128._8_8_ = (ParquetWriter *)0x0;
      *(code *)(pp_Var16 + 6) = local_159;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_128);
      *pp_Var16 = (_func_int *)&PTR__ListColumnWriter_0247ed60;
      pp_Var16[7] = p_Var15;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_d8);
      (local_150._M_head_impl)->_vptr_ColumnWriter = pp_Var16;
      goto LAB_01ba45a3;
    }
    bVar20 = LVar1 == ARRAY;
LAB_01ba45ea:
    if (bVar20) {
      pcVar18 = "array";
      if (LVar1 == LIST) {
        pcVar18 = "list";
      }
      local_128._0_8_ = local_128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_128,pcVar18,pcVar18 + ((ulong)(LVar1 == LIST) ^ 5));
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
      if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
        operator_delete((void *)local_128._0_8_);
      }
      pvVar14 = vector<duckdb::ParquetColumnSchema,_true>::operator[](&schema->children,0);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_b8 + 0x20),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_148);
      CreateWriterRecursive
                ((ColumnWriter *)local_b8,local_e8,local_158,parquet_schemas,pvVar14,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)(local_b8 + 0x20));
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_b8 + 0x20));
      if (LVar1 == LIST) {
        this_01 = (ArrayColumnWriter *)operator_new(0x40);
        pbVar4 = (pointer)(local_148->field_2)._M_allocated_capacity;
        pbVar5 = (pointer)(local_148->_M_dataplus)._M_p;
        pbVar6 = (pointer)local_148->_M_string_length;
        (local_148->_M_dataplus)._M_p = (pointer)0x0;
        local_148->_M_string_length = 0;
        (local_148->field_2)._M_allocated_capacity = 0;
        this_03 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_d8;
        local_d8._M_head_impl = (ColumnWriter *)0x0;
        p_Stack_d0 = (_func_int *)0x0;
        local_c8 = (_func_int *)0x0;
        (this_01->super_ListColumnWriter).super_ColumnWriter.writer = local_158;
        (this_01->super_ListColumnWriter).super_ColumnWriter.column_schema = local_130;
        (this_01->super_ListColumnWriter).super_ColumnWriter.schema_path.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = pbVar5;
        (this_01->super_ListColumnWriter).super_ColumnWriter.schema_path.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar6;
        (this_01->super_ListColumnWriter).super_ColumnWriter.schema_path.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar4;
        local_128._16_8_ = (ParquetColumnSchema *)0x0;
        local_128._0_8_ = (_func_int **)0x0;
        local_128._8_8_ = (ParquetWriter *)0x0;
        (this_01->super_ListColumnWriter).super_ColumnWriter.can_have_nulls = (bool)local_159;
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_128);
        (this_01->super_ListColumnWriter).super_ColumnWriter._vptr_ColumnWriter =
             (_func_int **)&PTR__ListColumnWriter_0247ed60;
        (this_01->super_ListColumnWriter).child_writer.
        super_unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>_>._M_t.
        super___uniq_ptr_impl<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>_>._M_t
        .super__Tuple_impl<0UL,_duckdb::ColumnWriter_*,_std::default_delete<duckdb::ColumnWriter>_>.
        super__Head_base<0UL,_duckdb::ColumnWriter_*,_false>._M_head_impl =
             (ColumnWriter *)local_b8._0_8_;
      }
      else {
        this_01 = (ArrayColumnWriter *)operator_new(0x40);
        local_128._0_8_ = (local_148->_M_dataplus)._M_p;
        local_128._8_8_ = local_148->_M_string_length;
        local_128._16_8_ = (local_148->field_2)._M_allocated_capacity;
        (local_148->_M_dataplus)._M_p = (pointer)0x0;
        local_148->_M_string_length = 0;
        (local_148->field_2)._M_allocated_capacity = 0;
        local_d8._M_head_impl = (ColumnWriter *)local_b8._0_8_;
        ArrayColumnWriter::ArrayColumnWriter
                  (this_01,local_158,local_130,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)local_128,
                   (unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>
                    *)&local_d8,(bool)local_159);
        if (local_d8._M_head_impl != (ColumnWriter *)0x0) {
          (*(local_d8._M_head_impl)->_vptr_ColumnWriter[1])();
        }
        local_d8._M_head_impl = (ColumnWriter *)0x0;
        this_03 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_128;
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(this_03);
      *(ArrayColumnWriter **)local_150._M_head_impl = this_01;
      return (unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>)
             local_150._M_head_impl;
    }
  }
  switch(LVar1) {
  case BOOLEAN:
    make_uniq<duckdb::BooleanColumnWriter,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case TINYINT:
    make_uniq<duckdb::StandardColumnWriter<signed_char,int,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case SMALLINT:
    goto LAB_01ba4ceb;
  case INTEGER:
  case DATE:
switchD_01ba4ac0_caseD_d:
    make_uniq<duckdb::StandardColumnWriter<int,int,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case BIGINT:
  case TIME:
  case TIMESTAMP_MS:
  case TIMESTAMP:
  case TIMESTAMP_TZ:
switchD_01ba4ac0_caseD_e:
    make_uniq<duckdb::StandardColumnWriter<long,long,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case TIMESTAMP_SEC:
    make_uniq<duckdb::StandardColumnWriter<long,long,duckdb::ParquetTimestampSOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case TIMESTAMP_NS:
    make_uniq<duckdb::StandardColumnWriter<long,long,duckdb::ParquetTimestampNSOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case DECIMAL:
    PVar2 = (local_130->type).physical_type_;
    if (PVar2 == INT64) goto switchD_01ba4ac0_caseD_e;
    if (PVar2 == INT32) goto switchD_01ba4ac0_caseD_d;
    if (PVar2 != INT16) {
      make_uniq<duckdb::FixedDecimalColumnWriter,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
                ((duckdb *)local_128,local_158,local_130,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)local_148,(bool *)&local_159);
      break;
    }
LAB_01ba4ceb:
    make_uniq<duckdb::StandardColumnWriter<short,int,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case FLOAT:
    make_uniq<duckdb::StandardColumnWriter<duckdb::float_na_equal,float,duckdb::FloatingPointOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case DOUBLE:
    make_uniq<duckdb::StandardColumnWriter<duckdb::double_na_equal,double,duckdb::FloatingPointOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case CHAR:
  case TIMESTAMP_TZ|SQLNULL:
  case TIME_TZ|SQLNULL:
  case BIT:
  case STRING_LITERAL:
  case INTEGER_LITERAL:
  case VARINT:
  case 0x28:
  case 0x29:
  case TIMESTAMP_TZ|BOOLEAN:
  case TIMESTAMP_TZ|TINYINT:
  case TIMESTAMP_TZ|SMALLINT:
  case TIMESTAMP_TZ|INTEGER:
  case TIMESTAMP_TZ|BIGINT:
  case TIMESTAMP_TZ|DATE:
  case TIMESTAMP_TZ|TIME:
  case POINTER:
  case TIMESTAMP_TZ|TIMESTAMP_NS:
  case VALIDITY:
switchD_01ba4ac0_caseD_18:
    this_02 = (InternalException *)__cxa_allocate_exception(0x10);
    local_128._0_8_ = local_128 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"Unsupported type \"%s\" in Parquet writer","");
    LogicalType::ToString_abi_cxx11_(&local_80,this_00);
    InternalException::InternalException<std::__cxx11::string>
              (this_02,(string *)local_128,&local_80);
    __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case VARCHAR:
    make_uniq<duckdb::StandardColumnWriter<duckdb::string_t,duckdb::string_t,duckdb::ParquetStringOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case BLOB:
    make_uniq<duckdb::StandardColumnWriter<duckdb::string_t,duckdb::string_t,duckdb::ParquetBlobOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case INTERVAL:
    make_uniq<duckdb::StandardColumnWriter<duckdb::interval_t,duckdb::ParquetIntervalTargetType,duckdb::ParquetIntervalOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case UTINYINT:
    make_uniq<duckdb::StandardColumnWriter<unsigned_char,int,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case USMALLINT:
    make_uniq<duckdb::StandardColumnWriter<unsigned_short,int,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case UINTEGER:
    make_uniq<duckdb::StandardColumnWriter<unsigned_int,unsigned_int,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case UBIGINT:
    make_uniq<duckdb::StandardColumnWriter<unsigned_long,unsigned_long,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case TIME_TZ:
    make_uniq<duckdb::StandardColumnWriter<duckdb::dtime_tz_t,long,duckdb::ParquetTimeTZOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case UHUGEINT:
    make_uniq<duckdb::StandardColumnWriter<duckdb::uhugeint_t,double,duckdb::ParquetUhugeintOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case HUGEINT:
    make_uniq<duckdb::StandardColumnWriter<duckdb::hugeint_t,double,duckdb::ParquetHugeintOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  case UUID:
    make_uniq<duckdb::StandardColumnWriter<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType,duckdb::ParquetUUIDOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
    break;
  default:
    if (LVar1 != ENUM) goto switchD_01ba4ac0_caseD_18;
    make_uniq<duckdb::EnumColumnWriter,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)local_128,local_158,local_130,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_159);
  }
LAB_01ba4e01:
  (local_150._M_head_impl)->_vptr_ColumnWriter = (_func_int **)local_128._0_8_;
  return (unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>_>)
         (_Tuple_impl<0UL,_duckdb::ColumnWriter_*,_std::default_delete<duckdb::ColumnWriter>_>)
         local_150._M_head_impl;
}

Assistant:

unique_ptr<ColumnWriter>
ColumnWriter::CreateWriterRecursive(ClientContext &context, ParquetWriter &writer,
                                    const vector<duckdb_parquet::SchemaElement> &parquet_schemas,
                                    const ParquetColumnSchema &schema, vector<string> path_in_schema) {
	auto &type = schema.type;
	auto can_have_nulls = parquet_schemas[schema.schema_index].repetition_type == FieldRepetitionType::OPTIONAL;
	path_in_schema.push_back(schema.name);
	if (type.id() == LogicalTypeId::STRUCT || type.id() == LogicalTypeId::UNION) {
		// construct the child writers recursively
		vector<unique_ptr<ColumnWriter>> child_writers;
		child_writers.reserve(schema.children.size());
		for (auto &child_column : schema.children) {
			child_writers.push_back(
			    CreateWriterRecursive(context, writer, parquet_schemas, child_column, path_in_schema));
		}
		return make_uniq<StructColumnWriter>(writer, schema, std::move(path_in_schema), std::move(child_writers),
		                                     can_have_nulls);
	}
	if (type.id() == LogicalTypeId::LIST || type.id() == LogicalTypeId::ARRAY) {
		auto is_list = type.id() == LogicalTypeId::LIST;
		path_in_schema.push_back(is_list ? "list" : "array");
		auto child_writer = CreateWriterRecursive(context, writer, parquet_schemas, schema.children[0], path_in_schema);
		if (is_list) {
			return make_uniq<ListColumnWriter>(writer, schema, std::move(path_in_schema), std::move(child_writer),
			                                   can_have_nulls);
		} else {
			return make_uniq<ArrayColumnWriter>(writer, schema, std::move(path_in_schema), std::move(child_writer),
			                                    can_have_nulls);
		}
	}
	if (type.id() == LogicalTypeId::MAP) {
		path_in_schema.push_back("key_value");
		// construct the child types recursively
		vector<unique_ptr<ColumnWriter>> child_writers;
		child_writers.reserve(2);
		for (idx_t i = 0; i < 2; i++) {
			// key needs to be marked as REQUIRED
			auto child_writer =
			    CreateWriterRecursive(context, writer, parquet_schemas, schema.children[i], path_in_schema);
			child_writers.push_back(std::move(child_writer));
		}
		auto struct_writer =
		    make_uniq<StructColumnWriter>(writer, schema, path_in_schema, std::move(child_writers), can_have_nulls);
		return make_uniq<ListColumnWriter>(writer, schema, path_in_schema, std::move(struct_writer), can_have_nulls);
	}
	if (type.id() == LogicalTypeId::BLOB && type.GetAlias() == "WKB_BLOB" &&
	    GeoParquetFileMetadata::IsGeoParquetConversionEnabled(context)) {
		return make_uniq<WKBColumnWriter>(writer, schema, std::move(path_in_schema), can_have_nulls, schema.name);
	}

	switch (type.id()) {
	case LogicalTypeId::BOOLEAN:
		return make_uniq<BooleanColumnWriter>(writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::TINYINT:
		return make_uniq<StandardColumnWriter<int8_t, int32_t>>(writer, schema, std::move(path_in_schema),
		                                                        can_have_nulls);
	case LogicalTypeId::SMALLINT:
		return make_uniq<StandardColumnWriter<int16_t, int32_t>>(writer, schema, std::move(path_in_schema),
		                                                         can_have_nulls);
	case LogicalTypeId::INTEGER:
	case LogicalTypeId::DATE:
		return make_uniq<StandardColumnWriter<int32_t, int32_t>>(writer, schema, std::move(path_in_schema),
		                                                         can_have_nulls);
	case LogicalTypeId::BIGINT:
	case LogicalTypeId::TIME:
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_TZ:
	case LogicalTypeId::TIMESTAMP_MS:
		return make_uniq<StandardColumnWriter<int64_t, int64_t>>(writer, schema, std::move(path_in_schema),
		                                                         can_have_nulls);
	case LogicalTypeId::TIME_TZ:
		return make_uniq<StandardColumnWriter<dtime_tz_t, int64_t, ParquetTimeTZOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::HUGEINT:
		return make_uniq<StandardColumnWriter<hugeint_t, double, ParquetHugeintOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::UHUGEINT:
		return make_uniq<StandardColumnWriter<uhugeint_t, double, ParquetUhugeintOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::TIMESTAMP_NS:
		return make_uniq<StandardColumnWriter<int64_t, int64_t, ParquetTimestampNSOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::TIMESTAMP_SEC:
		return make_uniq<StandardColumnWriter<int64_t, int64_t, ParquetTimestampSOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::UTINYINT:
		return make_uniq<StandardColumnWriter<uint8_t, int32_t>>(writer, schema, std::move(path_in_schema),
		                                                         can_have_nulls);
	case LogicalTypeId::USMALLINT:
		return make_uniq<StandardColumnWriter<uint16_t, int32_t>>(writer, schema, std::move(path_in_schema),
		                                                          can_have_nulls);
	case LogicalTypeId::UINTEGER:
		return make_uniq<StandardColumnWriter<uint32_t, uint32_t>>(writer, schema, std::move(path_in_schema),
		                                                           can_have_nulls);
	case LogicalTypeId::UBIGINT:
		return make_uniq<StandardColumnWriter<uint64_t, uint64_t>>(writer, schema, std::move(path_in_schema),
		                                                           can_have_nulls);
	case LogicalTypeId::FLOAT:
		return make_uniq<StandardColumnWriter<float_na_equal, float, FloatingPointOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::DOUBLE:
		return make_uniq<StandardColumnWriter<double_na_equal, double, FloatingPointOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::DECIMAL:
		switch (type.InternalType()) {
		case PhysicalType::INT16:
			return make_uniq<StandardColumnWriter<int16_t, int32_t>>(writer, schema, std::move(path_in_schema),
			                                                         can_have_nulls);
		case PhysicalType::INT32:
			return make_uniq<StandardColumnWriter<int32_t, int32_t>>(writer, schema, std::move(path_in_schema),
			                                                         can_have_nulls);
		case PhysicalType::INT64:
			return make_uniq<StandardColumnWriter<int64_t, int64_t>>(writer, schema, std::move(path_in_schema),
			                                                         can_have_nulls);
		default:
			return make_uniq<FixedDecimalColumnWriter>(writer, schema, std::move(path_in_schema), can_have_nulls);
		}
	case LogicalTypeId::BLOB:
		return make_uniq<StandardColumnWriter<string_t, string_t, ParquetBlobOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::VARCHAR:
		return make_uniq<StandardColumnWriter<string_t, string_t, ParquetStringOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::UUID:
		return make_uniq<StandardColumnWriter<hugeint_t, ParquetUUIDTargetType, ParquetUUIDOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::INTERVAL:
		return make_uniq<StandardColumnWriter<interval_t, ParquetIntervalTargetType, ParquetIntervalOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::ENUM:
		return make_uniq<EnumColumnWriter>(writer, schema, std::move(path_in_schema), can_have_nulls);
	default:
		throw InternalException("Unsupported type \"%s\" in Parquet writer", type.ToString());
	}
}